

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

uint32_t __thiscall HvFile::createpath(HvFile *this,HKEY root,pathmap_t *pmap,string *path)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 *puVar3;
  pointer ppVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  pVar5;
  uint32_t local_fc;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_e0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  local_b8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  ins;
  uint32_t local_88 [2];
  uint32_t id;
  byte local_71;
  string local_70;
  uint32_t local_4c;
  long lStack_48;
  uint32_t parentid;
  size_t slash;
  _Self local_38;
  iterator p;
  string *path_local;
  pathmap_t *pmap_local;
  HKEY root_local;
  HvFile *this_local;
  
  p._M_node = (_Base_ptr)path;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::find(pmap,path);
  slash = (size_t)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::end(pmap);
  bVar1 = std::operator!=(&local_38,(_Self *)&slash);
  if (bVar1) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             ::operator->(&local_38);
    this_local._4_4_ = ppVar4->second;
  }
  else {
    lStack_48 = std::__cxx11::string::find_last_of((char *)p._M_node,0x160bea);
    local_71 = 0;
    if (lStack_48 == -1) {
      local_fc = 0;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)p._M_node);
      local_71 = 1;
      local_fc = createpath(this,root,pmap,&local_70);
    }
    if ((local_71 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_70);
    }
    local_4c = local_fc;
    if (lStack_48 == -1) {
      std::__cxx11::string::string((string *)&ins.second,(string *)p._M_node);
    }
    else {
      std::__cxx11::string::substr((ulong)&ins.second,(ulong)p._M_node);
    }
    uVar2 = allocpath(this,root,local_fc,(string *)&ins.second);
    std::__cxx11::string::~string((string *)&ins.second);
    local_88[0] = uVar2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::pair<unsigned_int_&,_true>
              (&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p._M_node,
               local_88);
    pVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::insert(pmap,&local_e0);
    local_b8 = pVar5.first._M_node;
    ins.first._M_node._0_1_ = pVar5.second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair(&local_e0);
    if (((byte)ins.first._M_node & 1) == 0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "insert failed unexpectedly";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             ::operator->(&local_b8);
    this_local._4_4_ = ppVar4->second;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t createpath(HKEY root, pathmap_t& pmap, const std::string& path)
    {
        auto p= pmap.find(path);
        if (p!=pmap.end())
            return p->second;

        size_t slash= path.find_last_of("\\");
        uint32_t parentid= slash==path.npos ? 0 : createpath(root, pmap, path.substr(0,slash));

        uint32_t id= allocpath(root, parentid, slash==path.npos ? path : path.substr(slash+1));

        auto ins= pmap.insert(pathmap_t::value_type(path, id));
        if (!ins.second)
            throw "insert failed unexpectedly";
        return ins.first->second;
    }